

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O2

int checkerBig1(void)

{
  ulong uVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int p [2501];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = 0;
    iVar2 = 5000;
    while (iVar2 != 0) {
      __s = ScanInt((FILE *)__stream,p);
      if (__s != "PASSED") goto LAB_00103972;
      if ((uVar6 != p[0] && uVar6 < 0x9c5) || (iVar2 != p[0] && 0x9c4 < uVar6)) {
        printf("wrong output -- ");
        __s = "FAILED";
        goto LAB_00103972;
      }
      uVar6 = uVar6 + 1;
      iVar2 = iVar2 + -1;
    }
    lVar3 = 0;
    do {
      __s = "PASSED";
      if (lVar3 + 4 == 0x2718) break;
      __s = ScanInt((FILE *)__stream,(int *)((long)p + lVar3));
      lVar3 = lVar3 + 4;
    } while (__s == "PASSED");
    uVar4 = 0x9c6;
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      if (uVar5 == 0x9c5) break;
      uVar4 = uVar4 - 1;
      uVar1 = uVar5 + 1;
    } while (uVar4 == (uint)p[uVar5]);
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 0x9c4) break;
      uVar1 = uVar4 + 1;
    } while (uVar4 + 0x9c5 == (ulong)(uint)p[uVar4]);
    if ((uVar5 < 0x9c5) && (uVar4 < 0x9c4 || p[0x9c4] != 1)) {
      printf("wrong output -- ");
      __s = "FAILED";
    }
    if (__s == "PASSED") {
      iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
      if (iVar2 == 0) {
        __s = "PASSED";
      }
      else {
        __s = "FAILED";
      }
    }
LAB_00103972:
    fclose(__stream);
    puts(__s);
    uVar6 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar6;
}

Assistant:

static int checkerBig1(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    int p[2501], v1 = 1, v2 = 1; // two shortest paths exist
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if ((i <= 2500 && d != i) || (i > 2500 && d != 5000-i)) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        for (i = 0; i < 2501; i++) {
            message = ScanInt(out, &p[i]);
            if (message != Pass) {
                break;
            }
        }
        for (i = 0; i < 2501; i++)
            if (p[i] != 2501-i) { // 2501 2500 2499 ... 1
                v1 = 0;
                break;
            }
        for (i = 0; i < 2500; i++)
            if (p[i] != 2501+i) { // 2501 2502 ... 4999 5000 1
                v2 = 0;
                break;
            }
        if (p[2500] != 1) {
            v2 = 0;
        }
        if (v1 == 0 && v2 == 0) {
            printf("wrong output -- ");
            message = Fail;
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}